

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O0

R_conflict7 * parse_token(QByteArrayView data)

{
  char ch;
  qsizetype qVar1;
  R_conflict7 *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  qsizetype i;
  bool local_31;
  R_conflict7 *pos;
  QByteArrayView *pQVar3;
  QByteArrayView *this;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QByteArrayView *)0x0;
  pos = in_RDI;
  while( true ) {
    this = pQVar3;
    qVar1 = QByteArrayView::size(&local_18);
    local_31 = false;
    if ((long)pQVar3 < qVar1) {
      ch = QByteArrayView::operator[](&local_18,(qsizetype)this);
      local_31 = is_tchar(ch);
    }
    if (local_31 == false) break;
    pQVar3 = (QByteArrayView *)((long)&this->m_size + 1);
  }
  QVar2 = QByteArrayView::first(&local_18,0x33516e);
  in_RDI->token = QVar2;
  QVar2 = QByteArrayView::sliced(this,(qsizetype)pos);
  in_RDI->tail = QVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pos;
  }
  __stack_chk_fail();
}

Assistant:

static constexpr auto parse_token(QByteArrayView data) noexcept
{
    struct R {
        QByteArrayView token, tail;
        constexpr explicit operator bool() const noexcept { return !token.isEmpty(); }
    };

    qsizetype i = 0;
    while (i < data.size() && is_tchar(data[i]))
        ++i;

    return R{data.first(i), data.sliced(i)};
}